

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O0

void softfloat_to_vfp_compare(CPUARMState_conflict *env,int cmp)

{
  uint32_t uVar1;
  uint32_t local_18;
  uint32_t flags;
  int cmp_local;
  CPUARMState_conflict *env_local;
  
  if (cmp + 1U < 3 || cmp == 2) {
    switch((long)&switchD_00802658::switchdataD_013797fc +
           (long)(int)(&switchD_00802658::switchdataD_013797fc)[cmp + 1U]) {
    case 0x80265a:
      local_18 = 6;
      break;
    case 0x802663:
      local_18 = 8;
      break;
    case 0x80266c:
      local_18 = 2;
      break;
    case 0x802675:
      local_18 = 3;
    }
    uVar1 = deposit32((env->vfp).xregs[1],0x1c,4,local_18);
    (env->vfp).xregs[1] = uVar1;
    return;
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/vfp_helper.c"
             ,0x11a,(char *)0x0);
}

Assistant:

static void softfloat_to_vfp_compare(CPUARMState *env, int cmp)
{
    uint32_t flags = 0;
    switch (cmp) {
    case float_relation_equal:
        flags = 0x6;
        break;
    case float_relation_less:
        flags = 0x8;
        break;
    case float_relation_greater:
        flags = 0x2;
        break;
    case float_relation_unordered:
        flags = 0x3;
        break;
    default:
        g_assert_not_reached();
        break;
    }
    env->vfp.xregs[ARM_VFP_FPSCR] =
        deposit32(env->vfp.xregs[ARM_VFP_FPSCR], 28, 4, flags);
}